

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_mount_internal(char *args,MountType mnttype)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  FILE *__stream;
  int *piVar6;
  undefined8 uVar7;
  size_t __size;
  void *__ptr;
  size_t sVar8;
  
  if (*args == '\"') {
    args = args + 1;
    pcVar3 = strchr(args,0x22);
    if (pcVar3 != (char *)0x0) goto LAB_0010515d;
LAB_0010517e:
    pcVar3 = "missing string terminator in argument.";
    goto LAB_00105292;
  }
  pcVar3 = strchr(args,0x20);
LAB_0010515d:
  *pcVar3 = '\0';
  if (pcVar3[1] == '\"') {
    pcVar3 = pcVar3 + 2;
    pcVar4 = strchr(pcVar3,0x22);
    if (pcVar4 == (char *)0x0) goto LAB_0010517e;
  }
  else {
    pcVar3 = pcVar3 + 1;
    pcVar4 = strchr(pcVar3,0x20);
  }
  *pcVar4 = '\0';
  iVar2 = atoi(pcVar4 + 1);
  if (mnttype == MNTTYPE_HANDLE) {
    lVar5 = PHYSFS_openRead(args);
    if (lVar5 == 0) {
      uVar7 = PHYSFS_getLastError();
      iVar1 = 0;
      iVar2 = printf("PHYSFS_openRead(\'%s\') failed. reason: %s.\n",args,uVar7);
    }
    else {
      iVar1 = PHYSFS_mountHandle(lVar5,args,pcVar3,iVar2);
      iVar2 = iVar1;
      if (iVar1 == 0) {
        iVar2 = PHYSFS_close(lVar5);
      }
    }
    if (lVar5 == 0) {
      return iVar2;
    }
  }
  else if (mnttype == MNTTYPE_PATH) {
    iVar1 = PHYSFS_mount(args,pcVar3,iVar2);
  }
  else {
    __stream = fopen(args,"rb");
    if (__stream == (FILE *)0x0) {
      piVar6 = __errno_location();
      pcVar3 = strerror(*piVar6);
      printf("Failed to open %s to read into memory: %s.\n",args,pcVar3);
LAB_001052ec:
      iVar1 = 0;
      iVar2 = 0;
    }
    else {
      iVar1 = fseek(__stream,0,2);
      if ((iVar1 != 0) || (__size = ftell(__stream), (long)__size < 0)) {
        piVar6 = __errno_location();
        pcVar3 = strerror(*piVar6);
        pcVar4 = "Failed to find size of %s to read into memory: %s.\n";
LAB_0010524b:
        printf(pcVar4,args,pcVar3);
        fclose(__stream);
        goto LAB_001052ec;
      }
      __ptr = malloc(__size);
      if (__ptr == (void *)0x0) {
        piVar6 = __errno_location();
        pcVar3 = strerror(*piVar6);
        pcVar4 = "Failed to allocate space to read %s into memory: %s.\n";
        goto LAB_0010524b;
      }
      iVar1 = fseek(__stream,0,0);
      if ((iVar1 != 0) || (sVar8 = fread(__ptr,__size,1,__stream), sVar8 != 1)) {
        piVar6 = __errno_location();
        pcVar3 = strerror(*piVar6);
        printf("Failed to read %s into memory: %s.\n",args,pcVar3);
        fclose(__stream);
        free(__ptr);
        goto LAB_001052ec;
      }
      fclose(__stream);
      uVar7 = PHYSFS_mountMemory(__ptr,__size,freeBuf,args,pcVar3,iVar2);
      iVar1 = (int)uVar7;
      iVar2 = (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
    }
    if ((char)iVar2 == '\0') {
      return iVar2;
    }
  }
  if (iVar1 == 0) {
    uVar7 = PHYSFS_getLastError();
    iVar2 = printf("Failure. reason: %s.\n",uVar7);
    return iVar2;
  }
  pcVar3 = "Successful.";
LAB_00105292:
  iVar2 = puts(pcVar3);
  return iVar2;
}

Assistant:

static int cmd_mount_internal(char *args, const MountType mnttype)
{
    char *ptr;
    char *mntpoint = NULL;
    int appending = 0;
    int rc = 0;

    if (*args == '\"')
    {
        args++;
        ptr = strchr(args, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(args, ' ');
        *ptr = '\0';
    } /* else */

    mntpoint = ptr + 1;
    if (*mntpoint == '\"')
    {
        mntpoint++;
        ptr = strchr(mntpoint, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(mntpoint, ' ');
        *(ptr) = '\0';
    } /* else */
    appending = atoi(ptr + 1);

    /*printf("[%s], [%s], [%d]\n", args, mntpoint, appending);*/

    if (mnttype == MNTTYPE_PATH)
        rc = PHYSFS_mount(args, mntpoint, appending);

    else if (mnttype == MNTTYPE_HANDLE)
    {
        PHYSFS_File *f = PHYSFS_openRead(args);
        if (f == NULL)
        {
            printf("PHYSFS_openRead('%s') failed. reason: %s.\n", args, PHYSFS_getLastError());
            return 1;
        } /* if */

        rc = PHYSFS_mountHandle(f, args, mntpoint, appending);
        if (!rc)
            PHYSFS_close(f);
    } /* else if */

    else if (mnttype == MNTTYPE_MEMORY)
    {
        FILE *in = fopen(args, "rb");
        void *buf = NULL;
        long len = 0;

        if (in == NULL)
        {
            printf("Failed to open %s to read into memory: %s.\n", args, strerror(errno));
            return 1;
        } /* if */

        if ( (fseek(in, 0, SEEK_END) != 0) || ((len = ftell(in)) < 0) )
        {
            printf("Failed to find size of %s to read into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        buf = malloc(len);
        if (buf == NULL)
        {
            printf("Failed to allocate space to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            return 1;
        } /* if */

        if ((fseek(in, 0, SEEK_SET) != 0) || (fread(buf, len, 1, in) != 1))
        {
            printf("Failed to read %s into memory: %s.\n", args, strerror(errno));
            fclose(in);
            free(buf);
            return 1;
        } /* if */

        fclose(in);

        rc = PHYSFS_mountMemory(buf, len, freeBuf, args, mntpoint, appending);
    } /* else */

    if (rc)
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}